

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void bigval_add(bigval *r,bigval *a,bigval *b)

{
  ulong uVar1;
  BignumInt BVar2;
  ulong uVar3;
  BignumInt BVar4;
  ulong uVar5;
  ulong uVar6;
  BignumDblInt ADC_temp_1;
  BignumDblInt ADC_temp;
  BignumCarry carry;
  BignumInt v8;
  BignumInt v7;
  BignumInt v6;
  BignumInt v5;
  BignumInt v4;
  BignumInt v3;
  BignumInt v2;
  BignumInt v1;
  BignumInt v0;
  bigval *b_local;
  bigval *a_local;
  bigval *r_local;
  
  uVar1 = a->w[1];
  BVar2 = a->w[2];
  uVar3 = b->w[1];
  BVar4 = b->w[2];
  uVar5 = (ulong)CARRY8(a->w[0],b->w[0]);
  uVar6 = uVar1 + uVar3;
  r->w[0] = a->w[0] + b->w[0];
  r->w[1] = uVar6 + uVar5;
  r->w[2] = BVar2 + BVar4 + (ulong)CARRY8(uVar1,uVar3) + (ulong)CARRY8(uVar6,uVar5);
  return;
}

Assistant:

static void bigval_add(bigval *r, const bigval *a, const bigval *b)
{
    BignumInt v0, v1, v2, v3, v4, v5, v6, v7, v8;
    BignumCarry carry;

    v0 = a->w[0];
    v1 = a->w[1];
    v2 = a->w[2];
    v3 = b->w[0];
    v4 = b->w[1];
    v5 = b->w[2];
    BignumADC(v6, carry, v0, v3, 0);
    BignumADC(v7, carry, v1, v4, carry);
    v8 = v2 + v5 + carry;
    r->w[0] = v6;
    r->w[1] = v7;
    r->w[2] = v8;
}